

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O2

void __thiscall Cmd::refreshSingleLine(Cmd *this,State *state)

{
  ulong uVar1;
  size_type sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  string_view str;
  string ab;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  char seq [64];
  
  sVar2 = (this->prompt)._M_string_length;
  ab._M_dataplus._M_p = (pointer)&ab.field_2;
  ab._M_string_length = 0;
  ab.field_2._M_local_buf[0] = '\0';
  uVar3 = state->cols;
  uVar1 = state->pos + sVar2;
  uVar5 = uVar3 - 1;
  if (uVar1 < uVar3 - 1) {
    uVar5 = uVar1;
  }
  uVar4 = ((state->buf)._M_string_length + uVar5) - state->pos;
  local_78._M_str = (state->buf)._M_dataplus._M_p + (uVar1 - uVar5);
  if (uVar3 < uVar4) {
    uVar4 = uVar3;
  }
  local_78._M_len = uVar4 - sVar2;
  std::__cxx11::string::append((char *)&ab);
  std::__cxx11::string::append((string *)&ab);
  if (state->mask_mode == true) {
    std::__cxx11::string::append((ulong)&ab,(char)(uVar4 - sVar2));
  }
  else {
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&ab,&local_78);
  }
  refreshShowHints(this,&ab,state,(int)sVar2);
  std::__cxx11::string::append((char *)&ab);
  snprintf(seq,0x40,"\r\x1b[%dC",uVar5 & 0xffffffff);
  std::__cxx11::string::append((char *)&ab);
  str._M_str = ab._M_dataplus._M_p;
  str._M_len = ab._M_string_length;
  write_string(this,str);
  std::__cxx11::string::~string((string *)&ab);
  return;
}

Assistant:

void refreshSingleLine(State *state) {
		char seq[64];
		const size_t plen = prompt.size();
		std::string_view buf_view(state->buf);
		size_t pos = state->pos;
		std::string ab;

		while (plen + pos >= state->cols) {
			buf_view.remove_prefix(1);
			pos--;
		}

		while (plen + buf_view.size() > state->cols) {
			buf_view.remove_suffix(1);
		}

		// Cursor to left edge
		ab.append("\r");

		// Write the prompt and the current buffer content
		ab.append(prompt);

		if (state->mask_mode) {
			ab.append(buf_view.size(), '*');
		} else {
			ab.append(buf_view);
		}
		// Show hits if any.
		refreshShowHints(ab, state, plen);

		// Erase to right
		ab.append("\x1b[0K");

		// Move cursor to original position.
		snprintf(seq, sizeof(seq), "\r\x1b[%dC", static_cast<int>(pos + plen));
		ab.append(seq);

		write_string(ab);
	}